

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O0

void build_second_inter_pred
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MV *other_mv,int ref_idx,
               uint8_t *second_pred)

{
  undefined8 *puVar1;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  InterPredParams inter_pred_params;
  scale_factors sf;
  buf_2d ref_yv12;
  int plane;
  int p_row;
  int p_col;
  int mi_col;
  int mi_row;
  macroblockd_plane *pd;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int ph;
  int pw;
  AV1_COMMON *cm;
  int in_stack_fffffffffffffde8;
  undefined4 uVar2;
  int in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  int iVar3;
  undefined4 in_stack_fffffffffffffdf4;
  int in_stack_fffffffffffffdfc;
  int plane_00;
  int in_stack_fffffffffffffe04;
  int in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  uint uVar4;
  int_interpfilters interp_filters;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  scale_factors *in_stack_fffffffffffffe60;
  buf_2d *in_stack_fffffffffffffe68;
  undefined1 auStack_160 [168];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_84;
  int_interpfilters local_80;
  int local_7c;
  int local_78;
  int local_74;
  long local_70;
  long local_68;
  MACROBLOCKD *local_60;
  uint local_58;
  uint local_54;
  long local_50;
  
  local_50 = in_RDI + 0x3bf80;
  local_54 = (uint)block_size_wide[in_DL];
  local_58 = (uint)block_size_high[in_DL];
  local_60 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_68 = **(long **)(in_RSI + 0x2058);
  local_70 = in_RSI + 0x1b0;
  local_74 = local_60->mi_row;
  local_78 = *(int *)(in_RSI + 0x1a4);
  local_7c = (local_78 << 2) >> ((byte)*(undefined4 *)(in_RSI + 0x1b4) & 0x1f);
  local_80.as_int = (local_74 << 2) >> ((byte)*(undefined4 *)(in_RSI + 0x1b8) & 0x1f);
  local_84 = 0;
  puVar1 = (undefined8 *)(in_RSI + 0x1e0 + (long)(int)(uint)((in_R8D != 0 ^ 0xffU) & 1) * 0x20);
  local_a8 = *puVar1;
  local_a0 = puVar1[1];
  local_98 = puVar1[2];
  local_90 = puVar1[3];
  av1_setup_scale_factors_for_frame
            ((scale_factors *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,0,0x70da47);
  uVar2 = *(undefined4 *)(local_70 + 8);
  iVar3 = local_60->bd;
  uVar4 = local_54;
  interp_filters = local_80;
  is_cur_buf_hbd(local_60);
  plane_00 = 0;
  av1_init_inter_params
            ((InterPredParams *)CONCAT44(uVar4,in_stack_fffffffffffffe20),in_stack_fffffffffffffe1c,
             *(int *)(local_68 + 0x14),(int)((ulong)&local_a8 >> 0x20),(int)&local_a8,
             (int)((ulong)local_b8 >> 0x20),in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe68,interp_filters);
  get_conv_params(in_stack_fffffffffffffe04,plane_00,in_stack_fffffffffffffdfc);
  memcpy(auStack_160,&stack0xfffffffffffffe40,0x30);
  av1_enc_build_one_inter_predictor
            ((uint8_t *)CONCAT44(in_stack_fffffffffffffe04,plane_00),in_stack_fffffffffffffdfc,
             (MV *)CONCAT44(in_stack_fffffffffffffdf4,iVar3),
             (InterPredParams *)CONCAT44(in_stack_fffffffffffffdec,uVar2));
  return;
}

Assistant:

static inline void build_second_inter_pred(const AV1_COMP *cpi, MACROBLOCK *x,
                                           BLOCK_SIZE bsize, const MV *other_mv,
                                           int ref_idx, uint8_t *second_pred) {
  const AV1_COMMON *const cm = &cpi->common;
  const int pw = block_size_wide[bsize];
  const int ph = block_size_high[bsize];
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct macroblockd_plane *const pd = &xd->plane[0];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int p_col = ((mi_col * MI_SIZE) >> pd->subsampling_x);
  const int p_row = ((mi_row * MI_SIZE) >> pd->subsampling_y);

  // This function should only ever be called for compound modes
  assert(has_second_ref(mbmi));

  const int plane = 0;
  struct buf_2d ref_yv12 = xd->plane[plane].pre[!ref_idx];

  struct scale_factors sf;
  av1_setup_scale_factors_for_frame(&sf, ref_yv12.width, ref_yv12.height,
                                    cm->width, cm->height);

  InterPredParams inter_pred_params;

  av1_init_inter_params(&inter_pred_params, pw, ph, p_row, p_col,
                        pd->subsampling_x, pd->subsampling_y, xd->bd,
                        is_cur_buf_hbd(xd), 0, &sf, &ref_yv12,
                        mbmi->interp_filters);
  inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);

  // Get the prediction block from the 'other' reference frame.
  av1_enc_build_one_inter_predictor(second_pred, pw, other_mv,
                                    &inter_pred_params);
}